

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::TextureCubeMipmapCase::iterate(TextureCubeMipmapCase *this)

{
  deUint32 *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int y;
  int height;
  RenderContext *context;
  TextureCube *pTVar3;
  ConstPixelBufferAccess *pCVar4;
  TestLog *pTVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ConstPixelBufferAccess *pCVar8;
  ConstPixelBufferAccess *pCVar9;
  int iVar10;
  deUint32 dVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  NotSupportedError *this_01;
  pointer __n;
  Surface *pSVar15;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  char *description;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  allocator<char> local_4af;
  allocator<char> local_4ae;
  allocator<char> local_4ad;
  CoordType local_4ac;
  long local_4a8;
  long local_4a0;
  RandomViewport viewport;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  ConstPixelBufferAccess local_428;
  PixelBufferAccess local_3f8;
  PixelBufferAccess local_3d0;
  Surface referenceFrame;
  Surface renderedFrame;
  PixelBufferAccess local_378;
  Surface errorMask;
  undefined1 local_338 [32];
  float afStack_318 [2];
  BVec4 local_310;
  RenderParams params;
  undefined1 local_17c [84];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  anon_union_16_3_1194ccdc_for_v local_114;
  ulong local_104;
  LodMode local_fc;
  SurfaceAccess idealDst;
  PixelBufferAccess local_58;
  
  iVar12 = (this->m_texture->m_refTexture).m_size * 2;
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_4a8 = CONCAT44(extraout_var,iVar10);
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar11 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar10),iVar12,iVar12,dVar11);
  local_4ac = this->m_coordType;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  if ((iVar12 >> 1 <= viewport.width) && (iVar12 >> 1 <= viewport.height)) {
    glu::TextureCube::upload(this->m_texture);
    lVar16 = local_4a8;
    (**(code **)(local_4a8 + 0xb8))(0x8513,this->m_texture->m_glTexture);
    (**(code **)(lVar16 + 0x1360))(0x8513,0x2802,this->m_wrapS);
    (**(code **)(lVar16 + 0x1360))(0x8513,0x2803,this->m_wrapT);
    (**(code **)(lVar16 + 0x1360))(0x8513,0x2801,this->m_minFilter);
    (**(code **)(lVar16 + 0x1360))(0x8513,0x2800,0x2600);
    dVar11 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar11,"After texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x265);
    iVar10 = viewport.height;
    iVar12 = viewport.width;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    deRandom_init((deRandom *)&params,7);
    randomPartition(&gridLayout,(Random *)&params,0,0,iVar12,iVar10);
    if (iterate()::s_projections == '\0') {
      iVar12 = __cxa_guard_acquire(&iterate()::s_projections);
      if (iVar12 != 0) {
        iterate::s_projections[0].m_data[0] = _DAT_01801430;
        iterate::s_projections[0].m_data[1] = _UNK_01801434;
        iterate::s_projections[0].m_data[2] = _UNK_01801438;
        iterate::s_projections[0].m_data[3] = _UNK_0180143c;
        iterate::s_projections[1].m_data[0] = _DAT_01801570;
        iterate::s_projections[1].m_data[1] = _UNK_01801574;
        iterate::s_projections[1].m_data[2] = _UNK_01801578;
        iterate::s_projections[1].m_data[3] = _UNK_0180157c;
        iterate::s_projections[2].m_data[0] = _DAT_01801580;
        iterate::s_projections[2].m_data[1] = _UNK_01801584;
        iterate::s_projections[2].m_data[2] = _UNK_01801588;
        iterate::s_projections[2].m_data[3] = _UNK_0180158c;
        iterate::s_projections[3].m_data[0] = _DAT_01801590;
        iterate::s_projections[3].m_data[1] = _UNK_01801594;
        iterate::s_projections[3].m_data[2] = _UNK_01801598;
        iterate::s_projections[3].m_data[3] = _UNK_0180159c;
        __cxa_guard_release(&iterate()::s_projections);
      }
    }
    lVar16 = 0xc;
    uVar18 = 0;
    while( true ) {
      uVar17 = (uint)uVar18;
      if ((long)(int)((ulong)((long)gridLayout.
                                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)gridLayout.
                                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar18)
      break;
      iVar12 = *(int *)((long)(gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -0xc);
      iVar10 = *(int *)((long)(gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -8);
      uVar1 = *(undefined4 *)
               ((long)(gridLayout.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -4);
      uVar2 = *(undefined4 *)
               ((long)(gridLayout.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
      local_4a0 = lVar16;
      glu::TextureTestUtil::RenderParams::RenderParams(&params,TEXTURETYPE_CUBE);
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,(int)((uVar18 & 0xffffffff) / 6) * -6 + uVar17);
      if (local_4ac == COORDTYPE_PROJECTED) {
        params.flags = params.flags | 1;
        uVar14 = (ulong)((uVar17 & 3) << 4);
        uVar6 = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar14);
        uVar7 = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar14 + 8);
        params.w.m_data[0] = (float)uVar6;
        params.w.m_data[1] = (float)((ulong)uVar6 >> 0x20);
        params.w.m_data[2] = (float)uVar7;
        params.w.m_data[3] = (float)((ulong)uVar7 >> 0x20);
      }
      else if (local_4ac == COORDTYPE_BASIC_BIAS) {
        params.flags = params.flags | 2;
        params.bias = Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar17 & 7];
      }
      (**(code **)(local_4a8 + 0x1a00))(iVar12 + viewport.x,iVar10 + viewport.y,uVar1,uVar2);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&params);
      uVar18 = uVar18 + 1;
      lVar16 = local_4a0 + 0x10;
    }
    dVar11 = (**(code **)(local_4a8 + 0x800))();
    glu::checkError(dVar11,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x294);
    context = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&params,&renderedFrame);
    glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)&params);
    dVar11 = (**(code **)(local_4a8 + 0x800))();
    glu::checkError(dVar11,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x298);
    tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
    tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
    glu::TextureTestUtil::ReferenceParams::ReferenceParams
              ((ReferenceParams *)local_17c,TEXTURETYPE_CUBE);
    tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_338);
    lodPrec.rule = RULE_OPENGL;
    lodPrec.derivateBits = 0x16;
    lodPrec.lodBits = 0x10;
    glu::mapGLSampler((Sampler *)&params,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
    local_118 = params.ref;
    local_17c._80_4_ = (FilterMode)params.w.m_data[0];
    local_17c._76_4_ = params.flags;
    local_128 = params.w.m_data[1];
    fStack_124 = params.w.m_data[2];
    fStack_120 = params.w.m_data[3];
    fStack_11c = params.bias;
    local_17c._68_4_ = params.texType;
    local_17c._72_4_ = params.samplerType;
    local_114.fData[0] = params.colorScale.m_data[0];
    local_114.fData[1] = params.colorScale.m_data[1];
    local_114.fData[2] = params.colorScale.m_data[2];
    local_114.fData[3] = params.colorScale.m_data[3];
    local_104 = CONCAT44(params.colorBias.m_data[1],params.colorBias.m_data[0]) & 0xffffffffffffff00
    ;
    local_fc = LODMODE_EXACT;
    iVar12 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    glu::TextureTestUtil::getCompareMask((PixelFormat *)(CONCAT44(extraout_var_01,iVar12) + 8));
    uVar6 = params._0_8_;
    local_310.m_data[0] = (bool)(undefined1)params.texType;
    local_310.m_data[1] = (bool)params.texType._1_1_;
    local_310.m_data[2] = (bool)params.texType._2_1_;
    local_310.m_data[3] = (bool)params.texType._3_1_;
    params._0_8_ = uVar6;
    iVar12 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    local_428.m_format = *(TextureFormat *)(CONCAT44(extraout_var_02,iVar12) + 8);
    local_428.m_size.m_data._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_02,iVar12) + 0x10);
    tcu::operator-((tcu *)&local_3f8,(Vector<int,_4> *)&local_428,2);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3d0,0);
    tcu::max<int,4>((tcu *)&idealDst,(Vector<int,_4> *)&local_3f8,(Vector<int,_4> *)&local_3d0);
    tcu::computeFixedPointThreshold((tcu *)&params,(IVec4 *)&idealDst);
    bVar19 = local_4ac != COORDTYPE_PROJECTED;
    afStack_318[1] = params.w.m_data[0];
    afStack_318[0] = (float)params.flags;
    local_338._24_4_ = params.texType;
    local_338._28_4_ = params.samplerType;
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&params,(uint)bVar19 * 2 + 8);
    local_338._8_4_ = params.flags;
    local_338._0_4_ = params.texType;
    local_338._4_4_ = params.samplerType;
    local_338._12_4_ = 5;
    local_338._16_4_ = 5;
    local_338._20_4_ = 0;
    lodPrec.derivateBits = 10;
    uVar18 = 0;
    lVar16 = 0xc;
    iVar12 = 0;
    lodPrec.lodBits = (uint)bVar19 * 2 + 4;
    while( true ) {
      uVar17 = (uint)uVar18;
      if ((long)(int)((ulong)((long)gridLayout.
                                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)gridLayout.
                                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar18)
      break;
      iVar10 = *(int *)((long)(gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -0xc);
      y = *(int *)((long)(gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -8);
      local_4a0 = CONCAT44(local_4a0._4_4_,
                           *(undefined4 *)
                            ((long)(gridLayout.
                                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + -4
                            ));
      height = *(int *)((long)(gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
      local_4a8 = lVar16;
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,(int)((uVar18 & 0xffffffff) / 6) * -6 + uVar17);
      if (local_4ac == COORDTYPE_PROJECTED) {
        local_17c[8] = local_17c[8] | 1;
        uVar14 = (ulong)((uVar17 & 3) << 4);
        local_17c._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar14);
        local_17c._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar14 + 8);
      }
      else if (local_4ac == COORDTYPE_BASIC_BIAS) {
        local_17c[8] = local_17c[8] | 2;
        local_17c._28_4_ = Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar17 & 7];
      }
      iVar13 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      tcu::SurfaceAccess::SurfaceAccess
                (&idealDst,&referenceFrame,(PixelFormat *)(CONCAT44(extraout_var_03,iVar13) + 8),
                 iVar10,y,(int)local_4a0,height);
      pTVar3 = this->m_texture;
      pCVar4 = (pTVar3->m_refTexture).m_view.m_levels[5];
      params.colorScale.m_data[3] = SUB84(pCVar4,0);
      params.colorBias.m_data[0] = (float)((ulong)pCVar4 >> 0x20);
      params.texType = (pTVar3->m_refTexture).m_view.m_numLevels;
      params.samplerType = *(SamplerType *)&(pTVar3->m_refTexture).m_view.field_0x4;
      pCVar4 = (pTVar3->m_refTexture).m_view.m_levels[0];
      pCVar8 = (pTVar3->m_refTexture).m_view.m_levels[1];
      pCVar9 = (pTVar3->m_refTexture).m_view.m_levels[2];
      params._32_8_ = (pTVar3->m_refTexture).m_view.m_levels[3];
      params.colorScale.m_data._4_8_ = (pTVar3->m_refTexture).m_view.m_levels[4];
      params.w.m_data[1] = SUB84(pCVar8,0);
      params.w.m_data[2] = (float)((ulong)pCVar8 >> 0x20);
      params.w.m_data[3] = SUB84(pCVar9,0);
      params.bias = (float)((ulong)pCVar9 >> 0x20);
      params.flags = (deUint32)pCVar4;
      params.w.m_data[0] = (float)((ulong)pCVar4 >> 0x20);
      glu::TextureTestUtil::sampleTexture
                (&idealDst,(TextureCubeView *)&params,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_17c);
      tcu::Surface::getAccess(&local_3f8,&renderedFrame);
      tcu::getSubregion((PixelBufferAccess *)&idealDst,&local_3f8,iVar10,y,(int)local_4a0,height);
      tcu::Surface::getAccess(&local_3d0,&referenceFrame);
      tcu::getSubregion((PixelBufferAccess *)&local_428,&local_3d0,iVar10,y,(int)local_4a0,height);
      tcu::Surface::getAccess(&local_58,&errorMask);
      tcu::getSubregion(&local_378,&local_58,iVar10,y,(int)local_4a0,height);
      pTVar3 = this->m_texture;
      pCVar4 = (pTVar3->m_refTexture).m_view.m_levels[5];
      params.colorScale.m_data[3] = SUB84(pCVar4,0);
      params.colorBias.m_data[0] = (float)((ulong)pCVar4 >> 0x20);
      params.texType = (pTVar3->m_refTexture).m_view.m_numLevels;
      params.samplerType = *(SamplerType *)&(pTVar3->m_refTexture).m_view.field_0x4;
      pCVar4 = (pTVar3->m_refTexture).m_view.m_levels[0];
      pCVar8 = (pTVar3->m_refTexture).m_view.m_levels[1];
      pCVar9 = (pTVar3->m_refTexture).m_view.m_levels[2];
      params._32_8_ = (pTVar3->m_refTexture).m_view.m_levels[3];
      params.colorScale.m_data._4_8_ = (pTVar3->m_refTexture).m_view.m_levels[4];
      params.w.m_data[1] = SUB84(pCVar8,0);
      params.w.m_data[2] = (float)((ulong)pCVar8 >> 0x20);
      params.w.m_data[3] = SUB84(pCVar9,0);
      params.bias = (float)((ulong)pCVar9 >> 0x20);
      params.flags = (deUint32)pCVar4;
      params.w.m_data[0] = (float)((ulong)pCVar4 >> 0x20);
      iVar10 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)&idealDst,&local_428,&local_378,
                          (TextureCubeView *)&params,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ReferenceParams *)local_17c,
                          (LookupPrecision *)local_338,&lodPrec,
                          ((this->super_TestCase).super_TestNode.m_testCtx)->m_watchDog);
      iVar12 = iVar12 + iVar10;
      uVar18 = uVar18 + 1;
      lVar16 = local_4a8 + 0x10;
    }
    __n = gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start;
    if (0 < iVar12) {
      params._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      this_00 = &params.flags;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"ERROR: Image verification failed, found ");
      std::ostream::operator<<(this_00,iVar12);
      std::operator<<((ostream *)this_00," invalid pixels!");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&params,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    }
    pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"Result",(allocator<char> *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"Verification result",&local_4ad);
    tcu::LogImageSet::LogImageSet
              ((LogImageSet *)&idealDst,(string *)&local_3f8,(string *)&local_428);
    iVar10 = (int)pTVar5;
    tcu::LogImageSet::write((LogImageSet *)&idealDst,iVar10,__buf,(size_t)__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"Rendered",&local_4ae);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"Rendered image",&local_4af);
    pSVar15 = &renderedFrame;
    tcu::LogImage::LogImage
              ((LogImage *)&params,(string *)&local_3d0,(string *)&local_378,pSVar15,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&params,iVar10,__buf_00,(size_t)pSVar15);
    tcu::LogImage::~LogImage((LogImage *)&params);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_3d0);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&idealDst);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_3f8);
    if (0 < iVar12) {
      pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"Reference",(allocator<char> *)&local_58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"Ideal reference",&local_4ad);
      pSVar15 = &referenceFrame;
      tcu::LogImage::LogImage
                ((LogImage *)&params,(string *)&local_3f8,(string *)&local_428,pSVar15,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      iVar10 = (int)pTVar5;
      tcu::LogImage::write((LogImage *)&params,iVar10,__buf_01,(size_t)pSVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"ErrorMask",&local_4ae);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"Error mask",&local_4af);
      pSVar15 = &errorMask;
      tcu::LogImage::LogImage
                ((LogImage *)&idealDst,(string *)&local_3d0,(string *)&local_378,pSVar15,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&idealDst,iVar10,__buf_02,(size_t)pSVar15);
      tcu::LogImage::~LogImage((LogImage *)&idealDst);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_3d0);
      tcu::LogImage::~LogImage((LogImage *)&params);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_3f8);
    }
    tcu::TestLog::endImageSet(((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
    description = "Pass";
    if (iVar12 != 0) {
      description = "Image verification failed";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(iVar12 != 0),description);
    tcu::Surface::~Surface(&errorMask);
    tcu::Surface::~Surface(&referenceFrame);
    std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
              (&gridLayout.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
    tcu::Surface::~Surface(&renderedFrame);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
             ,0x259);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureCubeMipmapCase::IterateResult TextureCubeMipmapCase::iterate (void)
{
	const deUint32			magFilter			= GL_NEAREST;
	const int				texWidth			= m_texture->getRefTexture().getSize();
	const int				texHeight			= m_texture->getRefTexture().getSize();
	const int				defViewportWidth	= texWidth*2;
	const int				defViewportHeight	= texHeight*2;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	const RandomViewport	viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));

	const bool				isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool				useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	vector<float>			texCoord;
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);

	// Bail out if rendertarget is too small.
	if (viewport.width < defViewportWidth/2 || viewport.height < defViewportHeight/2)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewport.width, viewport.height);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	// Render with GL
	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const int			curX		= gridLayout[cellNdx].x();
		const int			curY		= gridLayout[cellNdx].y();
		const int			curW		= gridLayout[cellNdx].z();
		const int			curH		= gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);
		RenderParams		params		(TEXTURETYPE_CUBE);

		DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			params.flags	|= ReferenceParams::PROJECTED;
			params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			params.flags	|= ReferenceParams::USE_BIAS;
			params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render with GL.
		gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
		m_renderer.renderQuad(0, &texCoord[0], params);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

	// Render reference and compare
	{
		tcu::Surface			referenceFrame		(viewport.width, viewport.height);
		tcu::Surface			errorMask			(viewport.width, viewport.height);
		int						numFailedPixels		= 0;
		ReferenceParams			params				(TEXTURETYPE_CUBE);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_OPENGL);

		// Params for rendering reference
		params.sampler					= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
		params.sampler.seamlessCubeMap	= false;
		params.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask			= getCompareMask(m_renderCtx.getRenderTarget().getPixelFormat());
		lookupPrec.colorThreshold		= tcu::computeFixedPointThreshold(max(getBitsVec(m_renderCtx.getRenderTarget().getPixelFormat())-2, IVec4(0)));
		lookupPrec.coordBits			= isProjected ? tcu::IVec3(8) : tcu::IVec3(10);
		lookupPrec.uvwBits				= tcu::IVec3(5,5,0);
		lodPrec.derivateBits			= 10;
		lodPrec.lodBits					= isProjected ? 4 : 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
			computeQuadTexCoordCube(texCoord, cubeFace);

			if (isProjected)
			{
				params.flags	|= ReferenceParams::PROJECTED;
				params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
			}

			if (useLodBias)
			{
				params.flags	|= ReferenceParams::USE_BIAS;
				params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
			}

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
				sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], params);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getRefTexture(), &texCoord[0], params,
														lookupPrec, lodPrec, m_testCtx.getWatchDog());
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
						   << TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
							   << TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}